

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::FocusableItemRegister(ImGuiWindow *window,bool is_active,bool tab_stop)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  
  pIVar2 = GImGui;
  bVar1 = (window->DC).AllowKeyboardFocus;
  window->FocusIdxAllCounter = window->FocusIdxAllCounter + 1;
  if (bVar1 == true) {
    window->FocusIdxTabCounter = window->FocusIdxTabCounter + 1;
  }
  if (((tab_stop) && (window->FocusIdxAllRequestNext == 0x7fffffff)) &&
     (is_active && window->FocusIdxTabRequestNext == 0x7fffffff)) {
    bVar3 = IsKeyPressedMap(0,true);
    if (bVar3) {
      iVar4 = 1;
      if ((pIVar2->IO).KeyShift != false) {
        iVar4 = -(uint)bVar1;
      }
      window->FocusIdxTabRequestNext = iVar4 + window->FocusIdxTabCounter;
    }
  }
  bVar3 = true;
  if ((window->FocusIdxAllCounter != window->FocusIdxAllRequestCurrent) &&
     ((bVar1 == false || (window->FocusIdxTabCounter != window->FocusIdxTabRequestCurrent)))) {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, bool is_active, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool allow_keyboard_focus = window->DC.AllowKeyboardFocus;
    window->FocusIdxAllCounter++;
    if (allow_keyboard_focus)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB, Shift-TAB switch focus
    // We can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && is_active && IsKeyPressedMap(ImGuiKey_Tab))
    {
        // Modulo on index will be applied at the end of frame once we've got the total counter of items.
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (allow_keyboard_focus ? -1 : 0) : +1);
    }

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;

    if (allow_keyboard_focus)
        if (window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
            return true;

    return false;
}